

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,WriteBinarySpecStreamFactory *module_stream_factory,
                 Script *script,string_view source_filename,string_view module_filename_noext,
                 WriteBinaryOptions *options)

{
  Result RVar1;
  undefined1 local_e0 [8];
  BinaryWriterSpec binary_writer_spec;
  
  std::function<wabt::Stream_*(wabt::string_view)>::function
            ((function<wabt::Stream_*(wabt::string_view)> *)&binary_writer_spec.num_modules_,
             module_stream_factory);
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            ((BinaryWriterSpec *)local_e0,json_stream,
             (WriteBinarySpecStreamFactory *)&binary_writer_spec.num_modules_,source_filename,
             module_filename_noext,options);
  std::_Function_base::~_Function_base((_Function_base *)&binary_writer_spec.num_modules_);
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript((BinaryWriterSpec *)local_e0,script);
  anon_unknown_1::BinaryWriterSpec::~BinaryWriterSpec((BinaryWriterSpec *)local_e0);
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(Stream* json_stream,
                             WriteBinarySpecStreamFactory module_stream_factory,
                             Script* script,
                             string_view source_filename,
                             string_view module_filename_noext,
                             const WriteBinaryOptions& options) {
  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}